

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int memjrnlClose(sqlite3_file *pJfd)

{
  sqlite_int64 in_RSI;
  
  memjrnlTruncate(pJfd,in_RSI);
  return 0;
}

Assistant:

static int memjrnlClose(sqlite3_file *pJfd){
  memjrnlTruncate(pJfd, 0);
  return SQLITE_OK;
}